

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

ostream * cppcms::json::operator<<(ostream *out,json_type t)

{
  long lVar1;
  char *pcVar2;
  
  switch(t) {
  case is_undefined:
    pcVar2 = "undefined";
    lVar1 = 9;
    break;
  case is_null:
    pcVar2 = "null";
    lVar1 = 4;
    break;
  case is_boolean:
    pcVar2 = "boolean";
    goto LAB_00108032;
  case is_number:
    pcVar2 = "number";
    goto LAB_0010804e;
  case is_string:
    pcVar2 = "string";
    goto LAB_0010804e;
  case is_object:
    pcVar2 = "object";
LAB_0010804e:
    lVar1 = 6;
    break;
  case is_array:
    pcVar2 = "array";
    lVar1 = 5;
    break;
  default:
    pcVar2 = "Illegal";
LAB_00108032:
    lVar1 = 7;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out,json_type t)
	{
		switch(t) {
		case is_undefined: out<<"undefined"; break;
		case is_null: out<<"null"; break;
		case is_boolean: out<<"boolean"; break;
		case is_number: out<<"number"; break;
		case is_string: out<<"string"; break;
		case is_object: out<<"object"; break;
		case is_array: out<<"array"; break;
		default:
			out<<"Illegal";
		}
		return out;
	}